

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV4MeshLong(Parser *this,uint *iOut)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  
  for (pbVar2 = (byte *)this->filePtr; (*pbVar2 == 0x20 || (*pbVar2 == 9)); pbVar2 = pbVar2 + 1) {
  }
  this->filePtr = (char *)pbVar2;
  bVar1 = *pbVar2;
  if ((bVar1 < 0xe) && ((0x3401U >> (bVar1 & 0x1f) & 1) != 0)) {
    LogWarning(this,"Unable to parse long: unexpected EOL [#1]");
    *iOut = 0;
    this->iLineNumber = this->iLineNumber + 1;
  }
  else {
    uVar3 = 0;
    if (0xf5 < (byte)(bVar1 - 0x3a)) {
      uVar3 = 0;
      do {
        uVar3 = (uint)(byte)(bVar1 - 0x30) + uVar3 * 10;
        bVar1 = pbVar2[1];
        pbVar2 = pbVar2 + 1;
      } while (0xf5 < (byte)(bVar1 - 0x3a));
    }
    this->filePtr = (char *)pbVar2;
    *iOut = uVar3;
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshLong(unsigned int& iOut)
{
    // Skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        // LOG
        LogWarning("Unable to parse long: unexpected EOL [#1]");
        iOut = 0;
        ++iLineNumber;
        return;
    }
    // parse the value
    iOut = strtoul10(filePtr,&filePtr);
}